

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_interface.h
# Opt level: O0

int katherine_cmd_wait_ack_crd(katherine_udp_t *udp,char *ack)

{
  int res;
  char *ack_local;
  katherine_udp_t *udp_local;
  
  udp_local._4_4_ = katherine_udp_recv_exact(udp,ack,8);
  if (udp_local._4_4_ == 0) {
    udp_local._4_4_ = 0;
  }
  return udp_local._4_4_;
}

Assistant:

static inline int
katherine_cmd_wait_ack_crd(katherine_udp_t* udp, char *ack)
{
    int res;

    res = katherine_udp_recv_exact(udp, ack, 8);
    if (res) goto err;

    // TODO: optionally check command response id
    return 0;

err:
    return res;
}